

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O0

void __thiscall DROPlayer::GenerateDeviceConfig(DROPlayer *this)

{
  size_type sVar1;
  char *pcVar2;
  reference pvVar3;
  char *local_c0;
  allocator local_99;
  value_type local_98;
  allocator local_61;
  value_type local_60;
  reference local_40;
  DEV_GEN_CFG *devCfg;
  char chipNameFull [16];
  char *chipName;
  size_t curDev;
  DROPlayer *this_local;
  
  std::vector<_device_generic_config,_std::allocator<_device_generic_config>_>::clear
            (&this->_devCfgs);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_devTypes);
  std::vector<_device_generic_config,_std::allocator<_device_generic_config>_>::resize
            (&this->_devCfgs,sVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->_devNames);
  chipName = (char *)0x0;
  while( true ) {
    pcVar2 = (char *)std::vector<_device_generic_config,_std::allocator<_device_generic_config>_>::
                     size(&this->_devCfgs);
    if (pcVar2 <= chipName) break;
    local_40 = std::vector<_device_generic_config,_std::allocator<_device_generic_config>_>::
               operator[](&this->_devCfgs,(size_type)chipName);
    memset(local_40,0,0x10);
    local_40->clock = 0x369e99;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->_devTypes,(size_type)chipName);
    if (*pvVar3 == '\f') {
      local_40->clock = local_40->clock << 2;
    }
    local_40->flags = '\0';
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->_devTypes,(size_type)chipName);
    if (*pvVar3 == '\f') {
      local_c0 = "OPL3";
    }
    else {
      local_c0 = "OPL2";
    }
    sVar1 = std::vector<_device_generic_config,_std::allocator<_device_generic_config>_>::size
                      (&this->_devCfgs);
    if (sVar1 < 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_60,local_c0,&local_61);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->_devNames,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
    }
    else {
      snprintf((char *)&devCfg,0x10,"%s #%u",local_c0,(ulong)((int)chipName + 1));
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_98,(char *)&devCfg,&local_99);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->_devNames,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    chipName = chipName + 1;
  }
  return;
}

Assistant:

void DROPlayer::GenerateDeviceConfig(void)
{
	size_t curDev;
	const char* chipName;
	char chipNameFull[0x10];
	
	_devCfgs.clear();
	_devCfgs.resize(_devTypes.size());
	_devNames.clear();
	for (curDev = 0; curDev < _devCfgs.size(); curDev ++)
	{
		DEV_GEN_CFG* devCfg = &_devCfgs[curDev];
		memset(devCfg, 0x00, sizeof(DEV_GEN_CFG));
		
		devCfg->clock = 3579545;
		if (_devTypes[curDev] == DEVID_YMF262)
			devCfg->clock *= 4;	// OPL3 uses a 14 MHz clock
		devCfg->flags = 0x00;
		
		chipName = (_devTypes[curDev] == DEVID_YMF262) ? "OPL3" : "OPL2";
		if (_devCfgs.size() <= 1)
		{
			_devNames.push_back(chipName);
		}
		else
		{
			snprintf(chipNameFull, 0x10, "%s #%u", chipName, 1 + (unsigned int)curDev);
			_devNames.push_back(chipNameFull);
		}
	}
	
	return;
}